

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scanner.c
# Opt level: O1

int yaml_parser_scan_version_directive_number
              (yaml_parser_t *parser,yaml_mark_t start_mark,int *number)

{
  byte bVar1;
  size_t *psVar2;
  byte bVar3;
  int iVar4;
  int iVar5;
  byte *pbVar6;
  char *pcVar7;
  size_t sVar8;
  long lVar9;
  byte bVar10;
  long lVar11;
  
  if ((parser->unread != 0) || (iVar4 = yaml_parser_update_buffer(parser,1), iVar4 != 0)) {
    pbVar6 = (parser->buffer).pointer;
    bVar10 = *pbVar6;
    bVar1 = bVar10 - 0x3a;
    iVar4 = 0;
    if (0xf5 < bVar1) {
      iVar4 = 0;
      lVar11 = 10;
      do {
        lVar11 = lVar11 + -1;
        if (lVar11 == 0) {
          parser->error = YAML_SCANNER_ERROR;
          parser->context = "while scanning a %YAML directive";
          (parser->context_mark).index = start_mark.index;
          (parser->context_mark).line = start_mark.line;
          (parser->context_mark).column = start_mark.column;
          pcVar7 = "found extremely long version number";
          goto LAB_001b9471;
        }
        (parser->mark).index = (parser->mark).index + 1;
        psVar2 = &(parser->mark).column;
        *psVar2 = *psVar2 + 1;
        sVar8 = parser->unread - 1;
        parser->unread = sVar8;
        bVar3 = *pbVar6;
        lVar9 = 1;
        if ((((char)bVar3 < '\0') && (lVar9 = 2, (bVar3 & 0xe0) != 0xc0)) &&
           (lVar9 = 3, (bVar3 & 0xf0) != 0xe0)) {
          lVar9 = (ulong)((bVar3 & 0xf8) == 0xf0) << 2;
        }
        (parser->buffer).pointer = pbVar6 + lVar9;
        if ((sVar8 == 0) && (iVar5 = yaml_parser_update_buffer(parser,1), iVar5 == 0)) {
          return 0;
        }
        iVar4 = (uint)bVar10 + iVar4 * 10 + -0x30;
        pbVar6 = (parser->buffer).pointer;
        bVar10 = *pbVar6;
      } while ((byte)(bVar10 - 0x30) < 10);
    }
    if (0xf5 < bVar1) {
      *number = iVar4;
      return 1;
    }
    parser->error = YAML_SCANNER_ERROR;
    parser->context = "while scanning a %YAML directive";
    (parser->context_mark).index = start_mark.index;
    (parser->context_mark).line = start_mark.line;
    (parser->context_mark).column = start_mark.column;
    pcVar7 = "did not find expected version number";
LAB_001b9471:
    parser->problem = pcVar7;
    sVar8 = (parser->mark).line;
    (parser->problem_mark).index = (parser->mark).index;
    (parser->problem_mark).line = sVar8;
    (parser->problem_mark).column = (parser->mark).column;
  }
  return 0;
}

Assistant:

static int
yaml_parser_scan_version_directive_number(yaml_parser_t *parser,
        yaml_mark_t start_mark, int *number)
{
    int value = 0;
    size_t length = 0;

    /* Repeat while the next character is digit. */

    if (!CACHE(parser, 1)) return 0;

    while (IS_DIGIT(parser->buffer))
    {
        /* Check if the number is too long. */

        if (++length > MAX_NUMBER_LENGTH) {
            return yaml_parser_set_scanner_error(parser, "while scanning a %YAML directive",
                    start_mark, "found extremely long version number");
        }

        value = value*10 + AS_DIGIT(parser->buffer);

        SKIP(parser);

        if (!CACHE(parser, 1)) return 0;
    }

    /* Check if the number was present. */

    if (!length) {
        return yaml_parser_set_scanner_error(parser, "while scanning a %YAML directive",
                start_mark, "did not find expected version number");
    }

    *number = value;

    return 1;
}